

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  uchar *puVar1;
  dynbuf *s;
  undefined1 *puVar2;
  FILE *pFVar3;
  CURLcode CVar4;
  CURLMcode CVar5;
  size_t sVar6;
  char *pcVar7;
  timediff_t tVar8;
  undefined8 uVar9;
  uchar *puVar10;
  Curl_easy *local_50;
  dnsprobe *local_48;
  CURLM *local_40;
  char *local_38;
  
  local_50 = (Curl_easy *)0x0;
  sVar6 = strlen(host);
  uVar9 = 0xd;
  if ((sVar6 - (host[sVar6 - 1] == '.')) + 0x12 < 0x111) {
    p->dohbuffer[0] = '\0';
    p->dohbuffer[1] = '\0';
    p->dohbuffer[2] = '\x01';
    p->dohbuffer[3] = '\0';
    p->dohbuffer[4] = '\0';
    p->dohbuffer[5] = '\x01';
    puVar10 = p->dohbuffer + 0xc;
    p->dohbuffer[6] = '\0';
    p->dohbuffer[7] = '\0';
    p->dohbuffer[8] = '\0';
    p->dohbuffer[9] = '\0';
    p->dohbuffer[10] = '\0';
    p->dohbuffer[0xb] = '\0';
    local_48 = p;
    local_40 = multi;
    local_38 = url;
    for (; *host != '\0'; host = host + ((sVar6 + 1) - (ulong)(pcVar7 == (char *)0x0))) {
      pcVar7 = strchr(host,0x2e);
      if (pcVar7 == (char *)0x0) {
        sVar6 = strlen(host);
      }
      else {
        sVar6 = (long)pcVar7 - (long)host;
      }
      if (0x3e < sVar6 - 1) {
        local_48->dohlen = 0;
        uVar9 = 1;
        goto LAB_005f13ff;
      }
      *puVar10 = (uchar)sVar6;
      memcpy(puVar10 + 1,host,sVar6);
      puVar10 = puVar10 + sVar6 + 1;
    }
    puVar1 = local_48->dohbuffer;
    puVar10[0] = '\0';
    puVar10[1] = '\0';
    puVar10[2] = (uchar)dnstype;
    puVar10[3] = '\0';
    puVar10[4] = '\x01';
    local_48->dohlen = (size_t)(puVar10 + (5 - (long)puVar1));
    local_48->dnstype = dnstype;
    s = &local_48->serverdoh;
    Curl_dyn_init(s,3000);
    tVar8 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar8 < 1) {
      CVar4 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      CVar4 = Curl_open(&local_50);
      if (CVar4 == CURLE_OK) {
        puVar2 = &(local_50->state).field_0x74c;
        *(uint *)puVar2 = *(uint *)puVar2 | 0x200000;
        CVar4 = curl_easy_setopt(local_50,CURLOPT_URL,local_38);
        if ((((((((CVar4 < CURLE_SETOPT_OPTION_SYNTAX) &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
                (CVar4 = curl_easy_setopt(local_50,CURLOPT_DEFAULT_PROTOCOL,"https"),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX)) &&
               (((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
                (CVar4 = curl_easy_setopt(local_50,CURLOPT_WRITEFUNCTION,doh_write_cb),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX)))) &&
              (((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
               ((CVar4 = curl_easy_setopt(local_50,CURLOPT_WRITEDATA,s),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))) &&
             ((CVar4 = curl_easy_setopt(local_50,CURLOPT_POSTFIELDS,puVar1),
              CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
              (((((((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
                   (CVar4 = curl_easy_setopt(local_50,CURLOPT_POSTFIELDSIZE,local_48->dohlen),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX)) &&
                  ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
                 (((CVar4 = curl_easy_setopt(local_50,CURLOPT_HTTPHEADER,headers),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
                  ((CVar4 = curl_easy_setopt(local_50,CURLOPT_HTTP_VERSION,4),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                   (((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
                    (CVar4 = curl_easy_setopt(local_50,CURLOPT_PIPEWAIT,1),
                    CVar4 < CURLE_SETOPT_OPTION_SYNTAX)))))))) &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
               (((CVar4 = curl_easy_setopt(local_50,CURLOPT_PROTOCOLS,2),
                 CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
                (CVar4 = curl_easy_setopt(local_50,CURLOPT_TIMEOUT_MS,tVar8),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX)))))))) &&
            ((((((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
                (CVar4 = curl_easy_setopt(local_50,CURLOPT_SHARE,data->share),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX)) &&
               ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
              (((((pFVar3 = (data->set).err, pFVar3 == (FILE *)0x0 || (pFVar3 == _stderr)) ||
                 ((CVar4 = curl_easy_setopt(local_50,CURLOPT_STDERR),
                  CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                  ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
                ((((data->set).field_0x8bd & 0x10) == 0 ||
                 ((CVar4 = curl_easy_setopt(local_50,CURLOPT_VERBOSE,1),
                  CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                  ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))) &&
               ((((((data->set).field_0x8be & 1) == 0 ||
                  ((CVar4 = curl_easy_setopt(local_50,CURLOPT_NOSIGNAL,1),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
                 (CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_VERIFYHOST,
                                           (ulong)((uint)((ulong)*(undefined8 *)
                                                                  &(data->set).field_0x8ba >> 0x32)
                                                  & 2)), CVar4 < CURLE_SETOPT_OPTION_SYNTAX)) &&
                ((((((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0 &&
                    (CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_VERIFYPEER,
                                              (ulong)((uint)((ulong)*(undefined8 *)
                                                                     &(data->set).field_0x8ba >>
                                                            0x32) & 1)),
                    CVar4 < CURLE_SETOPT_OPTION_SYNTAX)) &&
                   ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)) &&
                  ((CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_VERIFYSTATUS,
                                             (ulong)((uint)((ulong)*(undefined8 *)
                                                                    &(data->set).field_0x8ba >> 0x34
                                                           ) & 1)),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
                 ((((data->set).ssl.field_0xb0 & 2) == 0 ||
                  ((CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_FALSESTART,1),
                   CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                   ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))))))))) &&
             (((data->set).str[0x1c] == (char *)0x0 ||
              ((CVar4 = curl_easy_setopt(local_50,CURLOPT_CAINFO),
               CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
               ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))))) &&
           ((((((data->set).blobs[6] == (curl_blob *)0x0 ||
               ((CVar4 = curl_easy_setopt(local_50,CURLOPT_CAINFO_BLOB),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
              ((((data->set).str[0x1a] == (char *)0x0 ||
                ((CVar4 = curl_easy_setopt(local_50,CURLOPT_CAPATH),
                 CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
               (((data->set).str[0x25] == (char *)0x0 ||
                ((CVar4 = curl_easy_setopt(local_50,CURLOPT_CRLFILE),
                 CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))))) &&
             ((((data->set).ssl.field_0xb0 & 1) == 0 ||
              ((CVar4 = curl_easy_setopt(local_50,CURLOPT_CERTINFO,1),
               CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
               ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))) &&
            ((((((data->set).ssl.fsslctx == (curl_ssl_ctx_callback)0x0 ||
                ((CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_CTX_FUNCTION),
                 CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
               (((data->set).ssl.fsslctxp == (void *)0x0 ||
                ((CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_CTX_DATA),
                 CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                 ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))) &&
              (((data->set).fdebug == (curl_debug_callback)0x0 ||
               ((CVar4 = curl_easy_setopt(local_50,CURLOPT_DEBUGFUNCTION),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))) &&
             ((((data->set).debugdata == (void *)0x0 ||
               ((CVar4 = curl_easy_setopt(local_50,CURLOPT_DEBUGDATA),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))) &&
              (((data->set).str[0x4b] == (char *)0x0 ||
               ((CVar4 = curl_easy_setopt(local_50,CURLOPT_SSL_EC_CURVES),
                CVar4 < CURLE_SETOPT_OPTION_SYNTAX &&
                ((0x1000000000011U >> ((ulong)CVar4 & 0x3f) & 1) != 0)))))))))))) {
          curl_easy_setopt(local_50,CURLOPT_SSL_OPTIONS,
                           (ulong)((byte)(data->set).ssl.field_0xb0 >> 2));
          (local_50->set).fmultidone = doh_done;
          (local_50->set).dohfor = data;
          local_48->easy = local_50;
          CVar5 = curl_multi_add_handle(local_40,local_50);
          if (CVar5 == CURLM_OK) {
            return CURLE_OK;
          }
        }
      }
    }
    Curl_close(&local_50);
  }
  else {
LAB_005f13ff:
    Curl_failf(data,"Failed to encode DoH packet [%d]",uVar9);
    CVar4 = CURLE_OUT_OF_MEMORY;
  }
  return CVar4;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->serverdoh, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dynbuf *resp = &p->serverdoh;
    doh->state.internal = true;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
    ERROR_CHECK_SETOPT(CURLOPT_PIPEWAIT, 1L);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
    /* in debug mode, also allow http */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    ERROR_CHECK_SETOPT(CURLOPT_SHARE, data->share);
    if(data->set.err && data->set.err != stderr)
      ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
      data->set.doh_verifyhost ? 2L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
      data->set.doh_verifypeer ? 1L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
      data->set.doh_verifystatus ? 1L : 0L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661

       Note DoH does not inherit the user's proxy server so proxy SSL settings
       have no effect and are not inherited. If that changes then two new
       options should be added to check doh proxy insecure separately,
       CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
       */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.str[STRING_SSL_CAFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                         data->set.str[STRING_SSL_CAFILE]);
    }
    if(data->set.blobs[BLOB_CAINFO]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                         data->set.blobs[BLOB_CAINFO]);
    }
    if(data->set.str[STRING_SSL_CAPATH]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                         data->set.str[STRING_SSL_CAPATH]);
    }
    if(data->set.str[STRING_SSL_CRLFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                         data->set.str[STRING_SSL_CRLFILE]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
    if(data->set.fdebug)
      ERROR_CHECK_SETOPT(CURLOPT_DEBUGFUNCTION, data->set.fdebug);
    if(data->set.debugdata)
      ERROR_CHECK_SETOPT(CURLOPT_DEBUGDATA, data->set.debugdata);
    if(data->set.str[STRING_SSL_EC_CURVES]) {
      ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                         data->set.str[STRING_SSL_EC_CURVES]);
    }

    {
      long mask =
        (data->set.ssl.enable_beast ?
         CURLSSLOPT_ALLOW_BEAST : 0) |
        (data->set.ssl.no_revoke ?
         CURLSSLOPT_NO_REVOKE : 0) |
        (data->set.ssl.no_partialchain ?
         CURLSSLOPT_NO_PARTIALCHAIN : 0) |
        (data->set.ssl.revoke_best_effort ?
         CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
        (data->set.ssl.native_ca_store ?
         CURLSSLOPT_NATIVE_CA : 0) |
        (data->set.ssl.auto_client_cert ?
         CURLSSLOPT_AUTO_CLIENT_CERT : 0);

      (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
    }

    doh->set.fmultidone = doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* DoH handles must not inherit private_data. The handles may be passed to
       the user via callbacks and the user will be able to identify them as
       internal handles because private data is not set. The user can then set
       private_data via CURLOPT_PRIVATE if they so choose. */
    DEBUGASSERT(!doh->set.private_data);

    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  return CURLE_OK;

error:
  Curl_close(&doh);
  return result;
}